

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

TRef snap_dedup(jit_State *J,SnapEntry *map,MSize nmax,IRRef ref)

{
  uint local_2c;
  MSize j;
  IRRef ref_local;
  MSize nmax_local;
  SnapEntry *map_local;
  jit_State *J_local;
  
  local_2c = 0;
  while( true ) {
    if (nmax <= local_2c) {
      return 0;
    }
    if ((map[local_2c] & 0xffff) == ref) break;
    local_2c = local_2c + 1;
  }
  return J->slot[map[local_2c] >> 0x18] & 0xffecffff;
}

Assistant:

static TRef snap_dedup(jit_State *J, SnapEntry *map, MSize nmax, IRRef ref)
{
  MSize j;
  for (j = 0; j < nmax; j++)
    if (snap_ref(map[j]) == ref)
      return J->slot[snap_slot(map[j])] & ~(SNAP_KEYINDEX|SNAP_CONT|SNAP_FRAME);
  return 0;
}